

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O0

void __thiscall GPIO::HitachiLCDBase::init_display(HitachiLCDBase *this)

{
  undefined8 in_RDI;
  HitachiLCDBase *unaff_retaddr;
  uchar func;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  undefined8 uVar2;
  uchar out;
  
  uVar2 = in_RDI;
  int_command_nibble(unaff_retaddr,(uchar)((ulong)in_RDI >> 0x38));
  out = (uchar)((ulong)uVar2 >> 0x38);
  int_command_nibble(unaff_retaddr,out);
  int_command_nibble(unaff_retaddr,out);
  uVar1 = 0x20;
  int_command_nibble(unaff_retaddr,out);
  int_command(unaff_retaddr,out);
  int_command(unaff_retaddr,out);
  int_display((HitachiLCDBase *)CONCAT17(uVar1,in_stack_fffffffffffffff0),
              SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
              SUB81((ulong)in_RDI >> 0x28,0));
  int_clear(unaff_retaddr);
  return;
}

Assistant:

void HitachiLCDBase::init_display()
{
    unsigned char func = LCD_FUNC | LCD_FUNC_DL;

    // set 4-bit 1-line mode 3 times

    int_command_nibble(func >> 4);
    int_command_nibble(func >> 4);
    int_command_nibble(func >> 4);

    // and switch to full 4-bit mode

    func = LCD_FUNC;
    int_command_nibble(func >> 4);

    int_command(LCD_ENTRY   | LCD_ENTRY_ID);
    int_command(LCD_CDSHIFT | LCD_CDSHIFT_RL);

    // and set display to init configuration

    int_display(true, false, false);
    int_clear();
}